

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void mean_double_2_suite::test_clear(void)

{
  value_type local_70;
  undefined8 local_68;
  moment<double,_2> filter;
  
  filter.member.window.super_span<double,_2UL>.member.size = 0;
  filter.member.window.super_span<double,_2UL>.member.next = 2;
  filter.member.mean = 0.0;
  filter.member.window.super_span<double,_2UL>.member.data = (pointer)&filter;
  trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::push(&filter,1.0);
  local_70 = (value_type)filter.member.window.super_span<double,_2UL>.member.size;
  local_68._0_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x8f,"void mean_double_2_suite::test_clear()",&local_70,&local_68);
  filter.member.mean = 0.0;
  filter.member.window.super_span<double,_2UL>.member.size = 0;
  local_70 = 0.0;
  filter.member.window.super_span<double,_2UL>.member.next = 2;
  local_68._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x91,"void mean_double_2_suite::test_clear()",&local_70,&local_68);
  trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::push(&filter,2.0);
  local_70 = (value_type)filter.member.window.super_span<double,_2UL>.member.size;
  local_68 = CONCAT44(local_68._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x93,"void mean_double_2_suite::test_clear()",&local_70,&local_68);
  local_70 = filter.member.mean;
  local_68 = 0x4000000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","2.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x94,"void mean_double_2_suite::test_clear()",&local_70,&local_68);
  return;
}

Assistant:

void test_clear()
{
    window::moment<double, 2> filter;
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 1);
    filter.clear();
    TRIAL_TEST_EQ(filter.size(), 0);
    filter.push(2.0);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 2.0);
}